

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

void __thiscall
Expression::Expression(Expression *this,BotscriptParser *parser,Lexer *lx,DataType reqtype)

{
  bool bVar1;
  undefined7 in_register_00000009;
  uchar *sig;
  uchar *in_R8;
  size_t in_R9;
  ExpressionSymbol *local_40;
  ExpressionSymbol *sym;
  DataType local_21;
  DataBuffer *pDStack_20;
  DataType reqtype_local;
  Lexer *lx_local;
  BotscriptParser *parser_local;
  Expression *this_local;
  
  this->m_parser = parser;
  this->m_lexer = lx;
  local_21 = reqtype;
  pDStack_20 = (DataBuffer *)lx;
  lx_local = (Lexer *)parser;
  parser_local = (BotscriptParser *)this;
  List<ExpressionSymbol_*>::List(&this->m_symbols);
  this->m_type = local_21;
  String::String(&this->m_badTokenText);
  while (local_40 = parseSymbol(this), local_40 != (ExpressionSymbol *)0x0) {
    parser = (BotscriptParser *)&local_40;
    List<ExpressionSymbol_*>::operator<<(&this->m_symbols,(ExpressionSymbol **)parser);
  }
  bVar1 = List<ExpressionSymbol_*>::isEmpty(&this->m_symbols);
  if (bVar1) {
    parser = (BotscriptParser *)&this->m_badTokenText;
    error<String>("unknown identifier \'%1\'",(String *)parser);
  }
  adjustOperators(this);
  verify(this,(EVP_PKEY_CTX *)parser,sig,CONCAT71(in_register_00000009,reqtype),in_R8,in_R9);
  evaluate(this);
  return;
}

Assistant:

Expression::Expression (BotscriptParser* parser, Lexer* lx, DataType reqtype) :
	m_parser (parser),
	m_lexer (lx),
	m_type (reqtype)
{
	ExpressionSymbol* sym;

	while ((sym = parseSymbol()) != null)
		m_symbols << sym;

	// If we were unable to get any expression symbols, something's wonky with
	// the script. Report an error. mBadTokenText is set to the token that
	// ParseSymbol ends at when it returns false.
	if (m_symbols.isEmpty())
		error ("unknown identifier '%1'", m_badTokenText);

	adjustOperators();
	verify();
	evaluate();
}